

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvParticle_dns.c
# Opt level: O0

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  undefined8 *puVar1;
  ulong *in_RCX;
  undefined8 in_RDX;
  sunrealtype *Jdata;
  UserData udata;
  
  puVar1 = (undefined8 *)SUNDenseMatrix_Data(in_RDX);
  *puVar1 = 0;
  puVar1[1] = *in_RCX ^ 0x8000000000000000;
  puVar1[2] = *in_RCX;
  puVar1[3] = 0;
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  UserData udata     = (UserData)user_data;
  sunrealtype* Jdata = SUNDenseMatrix_Data(J);

  Jdata[0] = ZERO;
  Jdata[1] = -(udata->alpha);
  Jdata[2] = (udata->alpha);
  Jdata[3] = ZERO;

  return (0);
}